

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

dir_tree_t * add_dirs(char **argv)

{
  FILE *__stream;
  short sVar1;
  long lVar2;
  long lVar3;
  dir_tree_t *pdVar4;
  size_t sVar5;
  file_entry_t *pfVar6;
  int *piVar7;
  char *pcVar8;
  dir_tree_t *pdVar9;
  dir_tree_t *unaff_R12;
  
  lVar2 = fts_open(argv,2,0);
  __stream = _stderr;
  if (lVar2 == 0) {
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    fprintf(__stream,"Failed to start directory traversal: %s\n",pcVar8);
    return (dir_tree_t *)0x0;
  }
  pdVar9 = (dir_tree_t *)0x0;
LAB_001034c4:
  do {
    lVar3 = fts_read(lVar2);
    if (lVar3 == 0) {
LAB_001035a3:
      fts_close(lVar2);
      return pdVar9;
    }
    sVar1 = *(short *)(lVar3 + 0x62);
    pdVar4 = pdVar9;
    if (sVar1 != 1) goto LAB_00103529;
    if (*(char *)(lVar3 + 0x70) == '.') {
      fts_set(lVar2,lVar3,4);
      sVar1 = *(short *)(lVar3 + 0x62);
      if (sVar1 != 1) goto LAB_00103529;
    }
  } while (*(short *)(lVar3 + 0x60) != 0);
  pdVar4 = alloc_dir_tree(*(char **)(lVar3 + 0x30));
  if (pdVar4 != (dir_tree_t *)0x0) {
    pdVar4->next = pdVar9;
    sVar1 = *(short *)(lVar3 + 0x62);
    unaff_R12 = pdVar4;
LAB_00103529:
    pdVar9 = pdVar4;
    if ((sVar1 != 8) ||
       (sVar5 = strlen((char *)(lVar3 + 0x70)), *(char *)(sVar5 + 0x6f + lVar3) == '~'))
    goto LAB_001034c4;
    pfVar6 = alloc_file_entry("",*(char **)(lVar3 + 0x30),
                              *(time_t *)(*(long *)(lVar3 + 0x68) + 0x58));
    if (pfVar6 != (file_entry_t *)0x0) {
      pfVar6->next = unaff_R12->files;
      unaff_R12->files = pfVar6;
      goto LAB_001034c4;
    }
  }
  no_mem = 1;
  goto LAB_001035a3;
}

Assistant:

dir_tree_t *add_dirs(char **argv)
{
	FTS *fts;
	FTSENT *ent;
	dir_tree_t *tree, *trees = NULL;
	file_entry_t *file;

	fts = fts_open(argv, FTS_LOGICAL, NULL);
	if (fts == NULL)
	{
		fprintf(stderr, "Failed to start directory traversal: %s\n", strerror(errno));
		return NULL;
	}
	while ((ent = fts_read(fts)) != NULL)
	{
		if (ent->fts_info == FTS_D && ent->fts_name[0] == '.')
		{
			// Skip hidden directories. (Prevents SVN bookkeeping
			// info from being included.)
			// [BL] Also skip backup files.
			fts_set(fts, ent, FTS_SKIP);
		}
		if (ent->fts_info == FTS_D && ent->fts_level == 0)
		{
			tree = alloc_dir_tree(ent->fts_path);
			if (tree == NULL)
			{
				no_mem = 1;
				break;
			}
			tree->next = trees;
			trees = tree;
		}
		if (ent->fts_info != FTS_F)
		{
			// We're only interested in remembering files.
			continue;
		}
		else if(ent->fts_name[strlen(ent->fts_name)-1] == '~')
		{
			// Don't remember backup files.
			continue;
		}
		file = alloc_file_entry("", ent->fts_path, ent->fts_statp->st_mtime);
		if (file == NULL)
		{
			no_mem = 1;
			break;
		}
		file->next = tree->files;
		tree->files = file;
	}
	fts_close(fts);
	return trees;
}